

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpecsOf.hpp
# Opt level: O2

void __thiscall
sciplot::TextSpecsOf<sciplot::TicsSpecsMajor>::TextSpecsOf
          (TextSpecsOf<sciplot::TicsSpecsMajor> *this,void **vtt)

{
  void *pvVar1;
  allocator<char> local_49;
  string local_48;
  
  FontSpecsOf<sciplot::TicsSpecsMajor>::FontSpecsOf
            (&this->super_FontSpecsOf<sciplot::TicsSpecsMajor>,vtt + 1);
  pvVar1 = *vtt;
  *(void **)&this->super_FontSpecsOf<sciplot::TicsSpecsMajor> = pvVar1;
  *(void **)(&(this->super_FontSpecsOf<sciplot::TicsSpecsMajor>).field_0x0 +
            *(long *)((long)pvVar1 + -0x28)) = vtt[3];
  (this->m_color)._M_dataplus._M_p = (pointer)&(this->m_color).field_2;
  (this->m_color)._M_string_length = 0;
  (this->m_color).field_2._M_local_buf[0] = '\0';
  (this->m_enhanced)._M_dataplus._M_p = (pointer)&(this->m_enhanced).field_2;
  (this->m_enhanced)._M_string_length = 0;
  (this->m_enhanced).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&this->m_enhanced);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"#404040",&local_49);
  textColor(this,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

TextSpecsOf<DerivedSpecs>::TextSpecsOf()
{
    enhanced(true);
    textColor(internal::DEFAULT_TEXTCOLOR);
}